

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceGLImpl::CreateDummyTexture
          (RenderDeviceGLImpl *this,TextureDesc *TexDesc,RESOURCE_STATE InitialState,
          ITexture **ppTexture)

{
  TextureBase<Diligent::EngineGLImplTraits> *this_00;
  string ObjectDescString;
  string msg;
  RenderDeviceGLImpl *local_28;
  
  if (ppTexture == (ITexture **)0x0) {
    FormatString<char[22]>(&msg,(char (*) [22])"Null pointer provided");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x1b1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (*ppTexture != (ITexture *)0x0) {
      FormatString<char[64]>
                (&msg,(char (*) [64])
                      "Overwriting reference to existing object may cause memory leaks");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CreateDeviceObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                 ,0x1b5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    *ppTexture = (ITexture *)0x0;
    if (TexDesc->Type == RESOURCE_DIM_TEX_2D) {
      msg._M_dataplus._M_p =
           (pointer)&(this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TexObjAllocator;
      msg._M_string_length = 0;
      msg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_2de83b;
      msg.field_2._8_8_ = anon_var_dwarf_2ce81d;
      local_28 = this;
      this_00 = (TextureBase<Diligent::EngineGLImplTraits> *)
                MakeNewRCObj<Diligent::Texture2D_GL,Diligent::FixedBlockMemoryAllocator>::operator()
                          ((MakeNewRCObj<Diligent::Texture2D_GL,Diligent::FixedBlockMemoryAllocator>
                            *)&msg,&(this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
                                    m_TexViewObjAllocator,&local_28,TexDesc);
    }
    else {
      this_00 = (TextureBase<Diligent::EngineGLImplTraits> *)0x0;
      LogError<true,char[26]>
                (false,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                 ,0x211,(char (*) [26])"Unsupported texture type.");
    }
    (**(_func_int **)
       (this_00->
       super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
       ).super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
       super_ITextureGL.super_ITexture.super_IDeviceObject.super_IObject)
              (this_00,IID_Texture,ppTexture);
    TextureBase<Diligent::EngineGLImplTraits>::CreateDefaultViews(this_00);
  }
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateDummyTexture(const TextureDesc& TexDesc, RESOURCE_STATE InitialState, ITexture** ppTexture)
{
    CreateDeviceObject(
        "texture", TexDesc, ppTexture,
        [&]() //
        {
            TextureBaseGL* pTextureOGL = nullptr;
            switch (TexDesc.Type)
            {
                case RESOURCE_DIM_TEX_2D:
                    pTextureOGL = NEW_RC_OBJ(m_TexObjAllocator, "Dummy Texture2D_GL instance", Texture2D_GL)(m_TexViewObjAllocator, this, TexDesc);
                    break;

                default: LOG_ERROR_AND_THROW("Unsupported texture type.");
            }

            pTextureOGL->QueryInterface(IID_Texture, reinterpret_cast<IObject**>(ppTexture));
            pTextureOGL->CreateDefaultViews();
        } //
    );
}